

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::ReverseLayerParams::ByteSizeLong(ReverseLayerParams *this)

{
  uint value;
  size_t sVar1;
  long lVar2;
  
  value = (this->reversedim_).current_size_;
  if ((ulong)value == 0) {
    lVar2 = 0;
  }
  else {
    sVar1 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar2 = sVar1 + 1;
  }
  this->_reversedim_cached_byte_size_ = value;
  sVar1 = lVar2 + (ulong)value;
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t ReverseLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ReverseLayerParams)
  size_t total_size = 0;

  // repeated bool reverseDim = 1;
  {
    unsigned int count = this->reversedim_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _reversedim_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}